

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O3

ans_byte_encode *
ans_byte_encode::create(ans_byte_encode *__return_storage_ptr__,uint8_t *in_u8,size_t n)

{
  byte *pbVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  size_t sVar5;
  long lVar6;
  unsigned_short uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  array<unsigned_long,_256UL> freqs;
  array<unsigned_long,_256UL> aStack_818;
  
  memset(__return_storage_ptr__,0,0x1200);
  memset(&aStack_818,0,0x800);
  if (n != 0) {
    sVar5 = 0;
    do {
      pbVar1 = in_u8 + sVar5;
      sVar5 = sVar5 + 1;
      aStack_818._M_elems[*pbVar1] = aStack_818._M_elems[*pbVar1] + 1;
    } while (n != sVar5);
  }
  adjust_freqs(&__return_storage_ptr__->nfreqs,&aStack_818);
  auVar10 = ZEXT1664((undefined1  [16])0x0);
  lVar6 = 0;
  do {
    auVar9 = vpmovzxwd_avx512f(*(undefined1 (*) [32])
                                ((__return_storage_ptr__->nfreqs)._M_elems + lVar6));
    lVar6 = lVar6 + 0x10;
    auVar10 = vpaddd_avx512f(auVar10,auVar9);
  } while (lVar6 != 0x100);
  auVar8 = vextracti64x4_avx512f(auVar10,1);
  lVar6 = 0x41;
  uVar7 = 0;
  auVar10 = vpaddd_avx512f(auVar10,ZEXT3264(auVar8));
  auVar3 = vpaddd_avx(auVar10._0_16_,auVar10._16_16_);
  auVar4 = vpshufd_avx(auVar3,0xee);
  auVar3 = vpaddd_avx(auVar3,auVar4);
  auVar4 = vpshufd_avx(auVar3,0x55);
  auVar3 = vpaddd_avx(auVar3,auVar4);
  __return_storage_ptr__->frame_size = (ulong)auVar3._0_4_;
  do {
    (__return_storage_ptr__->nfreqs)._M_elems[lVar6 * 4 + -4] =
         *(unsigned_short *)((long)(__return_storage_ptr__->nfreqs)._M_elems + lVar6 + -0x41);
    (__return_storage_ptr__->nfreqs)._M_elems[lVar6 * 4 + -3] = uVar7;
    uVar2 = *(ushort *)((long)(__return_storage_ptr__->nfreqs)._M_elems + lVar6 + -0x41);
    uVar7 = uVar7 + uVar2;
    *(ulong *)((__return_storage_ptr__->nfreqs)._M_elems + lVar6 * 4) = (ulong)uVar2 << 0x24;
    lVar6 = lVar6 + 2;
  } while (lVar6 != 0x241);
  __return_storage_ptr__->lower_bound = (ulong)auVar3._0_4_ << 4;
  return __return_storage_ptr__;
}

Assistant:

static ans_byte_encode create(const uint8_t* in_u8, size_t n)
    {
        ans_byte_encode model;
        std::array<uint64_t, constants::MAX_SIGMA> freqs { 0 };
        for (size_t i = 0; i < n; i++) {
            freqs[in_u8[i]]++;
        }
        model.nfreqs = adjust_freqs(freqs);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;
        for (size_t sym = 0; sym < constants::MAX_SIGMA; sym++) {
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }